

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_buf.c
# Opt level: O2

char * lj_buf_tmp(lua_State *L,MSize sz)

{
  uint64_t uVar1;
  char *pcVar2;
  
  uVar1 = (L->glref).ptr64;
  *(lua_State **)(uVar1 + 0xe0) = L;
  if (sz <= (uint)(*(int *)(uVar1 + 0xd0) - (int)*(char **)(uVar1 + 0xd8))) {
    return *(char **)(uVar1 + 0xd8);
  }
  pcVar2 = lj_buf_need2((SBuf *)(uVar1 + 200),sz);
  return pcVar2;
}

Assistant:

char * LJ_FASTCALL lj_buf_tmp(lua_State *L, MSize sz)
{
  SBuf *sb = &G(L)->tmpbuf;
  setsbufL(sb, L);
  return lj_buf_need(sb, sz);
}